

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O3

bool __thiscall ON_Brep::FlipReversedSurfaces(ON_Brep *this)

{
  int iVar1;
  ON_BrepFace *pOVar2;
  byte bVar3;
  long lVar4;
  bool bVar5;
  long lVar6;
  
  iVar1 = this->m_is_solid;
  lVar4 = (long)(this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
                m_count;
  if (lVar4 < 1) {
    bVar5 = true;
  }
  else {
    bVar5 = true;
    lVar6 = 0;
    do {
      pOVar2 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a;
      if ((pOVar2->m_face_uuid).Data4[lVar6 + -0x10] == '\x01') {
        bVar3 = (**(code **)(*(long *)((pOVar2->m_face_uuid).Data4 + lVar6 + -0x5c) + 0x1b0))();
        bVar5 = (bool)(bVar5 & bVar3);
      }
      lVar6 = lVar6 + 0xd8;
    } while (lVar4 * 0xd8 - lVar6 != 0);
  }
  this->m_is_solid = iVar1;
  return bVar5;
}

Assistant:

bool
ON_Brep::FlipReversedSurfaces()
{
  // Clears all ON_BrepFace.m_bRev flags
  // by calling SwapFaceParameters() on each
  // face with a true m_bRev.
  //
  // Returns true if successful.

  // 11 April 2008 Dale Lear and Tim:
  //   face.Transpose() is clearing the m_is_solid
  //   flag but we are not changing the orientation
  //   of the brep.  This prevents having to perform
  //   the expensive step of calculating this flag
  //   again.
  int saved_is_solid = m_is_solid;

  const int face_count = m_F.Count();

  bool rc = true;
  int fi;
  for ( fi = 0; fi < face_count; fi++ ) 
  {
    ON_BrepFace& face = m_F[fi];
    if ( face.m_bRev )
    {
      if ( !face.Transpose() )
        rc = false;
    }
  }

  m_is_solid = saved_is_solid;

  return rc;
}